

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::ReadNames<internal::NameHandler>
          (internal *this,CStringRef filename,StringRef data,NameHandler *handler)

{
  char *pcVar1;
  byte bVar2;
  ReadError *this_00;
  byte bVar3;
  undefined8 *puVar4;
  int arg1;
  char *pcVar5;
  CStringRef CVar6;
  char *pcVar7;
  char *local_38;
  
  puVar4 = (undefined8 *)data.size_;
  pcVar5 = data.data_;
  pcVar1 = filename.data_ + (long)pcVar5;
  if (pcVar5 == (char *)0x0) {
    arg1 = 1;
  }
  else {
    pcVar7 = filename.data_ + 1;
    bVar2 = 0;
    arg1 = 1;
    CVar6.data_ = filename.data_;
    do {
      bVar3 = bVar2;
      if (pcVar7[-1] == '\r') {
        bVar3 = 1;
      }
      if (pcVar7[-1] == '\n') {
        puVar4[1] = filename.data_;
        puVar4[2] = (long)CVar6.data_ - (long)(filename.data_ + bVar2);
        local_38 = filename.data_;
        std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)*puVar4,&local_38);
        arg1 = arg1 + 1;
        filename.data_ = pcVar7;
        bVar3 = 0;
      }
      bVar2 = bVar3;
      pcVar7 = pcVar7 + 1;
      CVar6.data_ = CVar6.data_ + 1;
      pcVar5 = pcVar5 + -1;
    } while (pcVar5 != (char *)0x0);
  }
  if (filename.data_ != pcVar1) {
    this_00 = (ReadError *)__cxa_allocate_exception(0x40);
    ReadError::ReadError<>
              (this_00,(CStringRef)this,arg1,((int)pcVar1 - (int)filename.data_) + 1,
               (CStringRef)0x17789f);
    __cxa_throw(this_00,&ReadError::typeinfo,ReadError::~ReadError);
  }
  return;
}

Assistant:

void ReadNames(fmt::CStringRef filename, fmt::StringRef data,
               NameHandler &handler) {
  bool in_win_newline = false;
  int line = 1;
  const char *start = data.data();
  const char *end = start + data.size();
  for (const char *ptr = start; ptr != end; ++ptr) {
    if (*ptr == '\r') in_win_newline = true;
    if (*ptr == '\n') {
      handler.OnName(fmt::StringRef(start, ptr - start - in_win_newline));
      start = ptr + 1;
      ++line;
      in_win_newline = false;
    }
  }
  if (start != end) {
    int column = static_cast<int>(end - start + 1);
    throw ReadError(filename, line, column, "missing newline");
  }
}